

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void Mean16x4_C(uint8_t *ref,uint32_t *dc)

{
  uint32_t avg;
  int y;
  int x;
  int k;
  uint32_t *dc_local;
  uint8_t *ref_local;
  
  ref_local = ref;
  for (k = 0; k < 4; k = k + 1) {
    avg = 0;
    for (y = 0; y < 4; y = y + 1) {
      for (x = 0; x < 4; x = x + 1) {
        avg = ref_local[x + y * 0x20] + avg;
      }
    }
    dc[k] = avg;
    ref_local = ref_local + 4;
  }
  return;
}

Assistant:

static void Mean16x4_C(const uint8_t* ref, uint32_t dc[4]) {
  int k, x, y;
  for (k = 0; k < 4; ++k) {
    uint32_t avg = 0;
    for (y = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x) {
        avg += ref[x + y * BPS];
      }
    }
    dc[k] = avg;
    ref += 4;   // go to next 4x4 block.
  }
}